

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::~MatcherBase
          (MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> *this)

{
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_RDI;
  
  ~MatcherBase(in_RDI);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }